

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zel_basic_leak_checker.cpp
# Opt level: O0

vector<validation_layer::ctorsAndDtors,_std::allocator<validation_layer::ctorsAndDtors>_> *
validation_layer::createDestroySet(void)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_01;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_02;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_03;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_04;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_05;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_06;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_07;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_08;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_09;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_10;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_11;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_12;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_13;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_14;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_15;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_16;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_17;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_18;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_19;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_20;
  initializer_list<validation_layer::ctorsAndDtors> __l_21;
  vector<validation_layer::ctorsAndDtors,_std::allocator<validation_layer::ctorsAndDtors>_> *in_RDI;
  string *local_df8;
  string *local_de0;
  string *local_dc8;
  string *local_db0;
  string *local_d98;
  string *local_d80;
  string *local_d68;
  string *local_d50;
  string *local_d38;
  string *local_d20;
  string *local_d08;
  string *local_cf0;
  string *local_cd8;
  string *local_cc0;
  string *local_ca8;
  string *local_c90;
  string *local_c78;
  string *local_c60;
  string *local_c48;
  string *local_c30;
  string *local_c18;
  string *local_c00;
  ctorsAndDtors *local_be8;
  allocator<validation_layer::ctorsAndDtors> local_867;
  undefined1 local_866;
  undefined1 local_865;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_864;
  undefined1 local_863;
  allocator local_862;
  allocator local_861;
  string *local_860;
  string local_858 [32];
  string local_838 [32];
  iterator local_818;
  size_type local_810;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_805;
  undefined1 local_804;
  allocator local_803;
  allocator local_802;
  allocator local_801;
  string *local_800;
  string local_7f8 [32];
  string local_7d8 [32];
  string local_7b8 [32];
  iterator local_798;
  size_type local_790;
  undefined1 local_784;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_783;
  undefined1 local_782;
  allocator local_781;
  string *local_780;
  string local_778 [32];
  iterator local_758;
  size_type local_750;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_743;
  undefined1 local_742;
  allocator local_741;
  string *local_740;
  string local_738 [32];
  iterator local_718;
  size_type local_710;
  undefined1 local_704;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_703;
  undefined1 local_702;
  allocator local_701;
  string *local_700;
  string local_6f8 [32];
  iterator local_6d8;
  size_type local_6d0;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_6c4;
  undefined1 local_6c3;
  allocator local_6c2;
  allocator local_6c1;
  string *local_6c0;
  string local_6b8 [32];
  string local_698 [32];
  iterator local_678;
  size_type local_670;
  undefined1 local_664;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_663;
  undefined1 local_662;
  allocator local_661;
  string *local_660;
  string local_658 [32];
  iterator local_638;
  size_type local_630;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_623;
  undefined1 local_622;
  allocator local_621;
  string *local_620;
  string local_618 [32];
  iterator local_5f8;
  size_type local_5f0;
  undefined1 local_5e4;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_5e3;
  undefined1 local_5e2;
  allocator local_5e1;
  string *local_5e0;
  string local_5d8 [32];
  iterator local_5b8;
  size_type local_5b0;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_5a3;
  undefined1 local_5a2;
  allocator local_5a1;
  string *local_5a0;
  string local_598 [32];
  iterator local_578;
  size_type local_570;
  undefined1 local_564;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_563;
  undefined1 local_562;
  allocator local_561;
  string *local_560;
  string local_558 [32];
  iterator local_538;
  size_type local_530;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_524;
  undefined1 local_523;
  allocator local_522;
  allocator local_521;
  string *local_520;
  string local_518 [32];
  string local_4f8 [32];
  iterator local_4d8;
  size_type local_4d0;
  undefined1 local_4c4;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_4c3;
  undefined1 local_4c2;
  allocator local_4c1;
  string *local_4c0;
  string local_4b8 [32];
  iterator local_498;
  size_type local_490;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_483;
  undefined1 local_482;
  allocator local_481;
  string *local_480;
  string local_478 [32];
  iterator local_458;
  size_type local_450;
  undefined1 local_444;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_443;
  undefined1 local_442;
  allocator local_441;
  string *local_440;
  string local_438 [32];
  iterator local_418;
  size_type local_410;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_403;
  undefined1 local_402;
  allocator local_401;
  string *local_400;
  string local_3f8 [32];
  iterator local_3d8;
  size_type local_3d0;
  undefined1 local_3c4;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_3c3;
  undefined1 local_3c2;
  allocator local_3c1;
  string *local_3c0;
  string local_3b8 [32];
  iterator local_398;
  size_type local_390;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_383;
  undefined1 local_382;
  allocator local_381;
  string *local_380;
  string local_378 [32];
  iterator local_358;
  size_type local_350;
  undefined1 local_344;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_343;
  undefined1 local_342;
  allocator local_341;
  string *local_340;
  string local_338 [32];
  iterator local_318;
  size_type local_310;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_303;
  undefined1 local_302;
  allocator local_301;
  string *local_300;
  string local_2f8 [32];
  iterator local_2d8;
  size_type local_2d0;
  undefined1 local_2c4;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2c3;
  undefined1 local_2c2;
  allocator local_2c1;
  string *local_2c0;
  string local_2b8 [32];
  iterator local_298;
  size_type local_290;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_286;
  undefined1 local_285;
  allocator local_271;
  string *local_270;
  string local_268 [32];
  iterator local_248;
  size_type local_240;
  ctorsAndDtors *local_238;
  ctorsAndDtors local_230;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_200;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vStack_1e8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1d0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vStack_1b8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1a0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vStack_188;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_170;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vStack_158;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_140;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vStack_128;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_110;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vStack_f8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_e0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vStack_c8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vStack_98;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_80;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vStack_68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_50;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vStack_38;
  iterator local_20;
  pointer local_18;
  
  local_866 = 1;
  local_285 = 1;
  local_270 = local_268;
  local_238 = &local_230;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_268,"zeContextCreate",&local_271);
  local_285 = 0;
  local_248 = (iterator)local_268;
  local_240 = 1;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_286);
  __l_20._M_len = local_240;
  __l_20._M_array = local_248;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_230.ctors,__l_20,&local_286);
  local_2c4 = 1;
  local_2c2 = 1;
  local_2c0 = local_2b8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2b8,"zeContextDestroy",&local_2c1);
  local_2c2 = 0;
  local_298 = (iterator)local_2b8;
  local_290 = 1;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_2c3);
  __l_19._M_len = local_290;
  __l_19._M_array = local_298;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_230.dtors,__l_19,&local_2c3);
  local_2c4 = 0;
  local_302 = 1;
  local_300 = local_2f8;
  local_238 = (ctorsAndDtors *)&local_200;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2f8,"zeCommandQueueCreate",&local_301);
  local_302 = 0;
  local_2d8 = (iterator)local_2f8;
  local_2d0 = 1;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_303);
  __l_18._M_len = local_2d0;
  __l_18._M_array = local_2d8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_200,__l_18,&local_303);
  local_344 = 1;
  local_342 = 1;
  local_340 = local_338;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_338,"zeCommandQueueDestroy",&local_341);
  local_342 = 0;
  local_318 = (iterator)local_338;
  local_310 = 1;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_343);
  __l_17._M_len = local_310;
  __l_17._M_array = local_318;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&vStack_1e8,__l_17,&local_343);
  local_344 = 0;
  local_382 = 1;
  local_380 = local_378;
  local_238 = (ctorsAndDtors *)&local_1d0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_378,"zeModuleCreate",&local_381);
  local_382 = 0;
  local_358 = (iterator)local_378;
  local_350 = 1;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_383);
  __l_16._M_len = local_350;
  __l_16._M_array = local_358;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_1d0,__l_16,&local_383);
  local_3c4 = 1;
  local_3c2 = 1;
  local_3c0 = local_3b8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3b8,"zeModuleDestroy",&local_3c1);
  local_3c2 = 0;
  local_398 = (iterator)local_3b8;
  local_390 = 1;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_3c3);
  __l_15._M_len = local_390;
  __l_15._M_array = local_398;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&vStack_1b8,__l_15,&local_3c3);
  local_3c4 = 0;
  local_402 = 1;
  local_400 = local_3f8;
  local_238 = (ctorsAndDtors *)&local_1a0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3f8,"zeKernelCreate",&local_401);
  local_402 = 0;
  local_3d8 = (iterator)local_3f8;
  local_3d0 = 1;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_403);
  __l_14._M_len = local_3d0;
  __l_14._M_array = local_3d8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_1a0,__l_14,&local_403);
  local_444 = 1;
  local_442 = 1;
  local_440 = local_438;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_438,"zeKernelDestroy",&local_441);
  local_442 = 0;
  local_418 = (iterator)local_438;
  local_410 = 1;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_443);
  __l_13._M_len = local_410;
  __l_13._M_array = local_418;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&vStack_188,__l_13,&local_443);
  local_444 = 0;
  local_482 = 1;
  local_480 = local_478;
  local_238 = (ctorsAndDtors *)&local_170;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_478,"zeEventPoolCreate",&local_481);
  local_482 = 0;
  local_458 = (iterator)local_478;
  local_450 = 1;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_483);
  __l_12._M_len = local_450;
  __l_12._M_array = local_458;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_170,__l_12,&local_483);
  local_4c4 = 1;
  local_4c2 = 1;
  local_4c0 = local_4b8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_4b8,"zeEventPoolDestroy",&local_4c1);
  local_4c2 = 0;
  local_498 = (iterator)local_4b8;
  local_490 = 1;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_4c3);
  __l_11._M_len = local_490;
  __l_11._M_array = local_498;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&vStack_158,__l_11,&local_4c3);
  local_4c4 = 0;
  local_523 = 1;
  local_520 = local_518;
  local_238 = (ctorsAndDtors *)&local_140;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_518,"zeCommandListCreateImmediate",&local_521);
  local_520 = local_4f8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_4f8,"zeCommandListCreate",&local_522);
  local_523 = 0;
  local_4d8 = (iterator)local_518;
  local_4d0 = 2;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_524);
  __l_10._M_len = local_4d0;
  __l_10._M_array = local_4d8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_140,__l_10,&local_524);
  local_564 = 1;
  local_562 = 1;
  local_560 = local_558;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_558,"zeCommandListDestroy",&local_561);
  local_562 = 0;
  local_538 = (iterator)local_558;
  local_530 = 1;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_563);
  __l_09._M_len = local_530;
  __l_09._M_array = local_538;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&vStack_128,__l_09,&local_563);
  local_564 = 0;
  local_5a2 = 1;
  local_5a0 = local_598;
  local_238 = (ctorsAndDtors *)&local_110;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_598,"zeEventCreate",&local_5a1);
  local_5a2 = 0;
  local_578 = (iterator)local_598;
  local_570 = 1;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_5a3);
  __l_08._M_len = local_570;
  __l_08._M_array = local_578;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_110,__l_08,&local_5a3);
  local_5e4 = 1;
  local_5e2 = 1;
  local_5e0 = local_5d8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_5d8,"zeEventDestroy",&local_5e1);
  local_5e2 = 0;
  local_5b8 = (iterator)local_5d8;
  local_5b0 = 1;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_5e3);
  __l_07._M_len = local_5b0;
  __l_07._M_array = local_5b8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&vStack_f8,__l_07,&local_5e3);
  local_5e4 = 0;
  local_622 = 1;
  local_620 = local_618;
  local_238 = (ctorsAndDtors *)&local_e0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_618,"zeFenceCreate",&local_621);
  local_622 = 0;
  local_5f8 = (iterator)local_618;
  local_5f0 = 1;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_623);
  __l_06._M_len = local_5f0;
  __l_06._M_array = local_5f8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_e0,__l_06,&local_623);
  local_664 = 1;
  local_662 = 1;
  local_660 = local_658;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_658,"zeFenceDestroy",&local_661);
  local_662 = 0;
  local_638 = (iterator)local_658;
  local_630 = 1;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_663);
  __l_05._M_len = local_630;
  __l_05._M_array = local_638;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&vStack_c8,__l_05,&local_663);
  local_664 = 0;
  local_6c3 = 1;
  local_6c0 = local_6b8;
  local_238 = (ctorsAndDtors *)&local_b0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_6b8,"zeImageCreate",&local_6c1);
  local_6c0 = local_698;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_698,"zeImageViewCreateExt",&local_6c2);
  local_6c3 = 0;
  local_678 = (iterator)local_6b8;
  local_670 = 2;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_6c4);
  __l_04._M_len = local_670;
  __l_04._M_array = local_678;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_b0,__l_04,&local_6c4);
  local_704 = 1;
  local_702 = 1;
  local_700 = local_6f8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_6f8,"zeImageDestroy",&local_701);
  local_702 = 0;
  local_6d8 = (iterator)local_6f8;
  local_6d0 = 1;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_703);
  __l_03._M_len = local_6d0;
  __l_03._M_array = local_6d8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&vStack_98,__l_03,&local_703);
  local_704 = 0;
  local_742 = 1;
  local_740 = local_738;
  local_238 = (ctorsAndDtors *)&local_80;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_738,"zeSamplerCreate",&local_741);
  local_742 = 0;
  local_718 = (iterator)local_738;
  local_710 = 1;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_743);
  __l_02._M_len = local_710;
  __l_02._M_array = local_718;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_80,__l_02,&local_743);
  local_784 = 1;
  local_782 = 1;
  local_780 = local_778;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_778,"zeSamplerDestroy",&local_781);
  local_782 = 0;
  local_758 = (iterator)local_778;
  local_750 = 1;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_783);
  __l_01._M_len = local_750;
  __l_01._M_array = local_758;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&vStack_68,__l_01,&local_783);
  local_784 = 0;
  local_804 = 1;
  local_800 = local_7f8;
  local_238 = (ctorsAndDtors *)&local_50;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_7f8,"zeMemAllocDevice",&local_801);
  local_800 = local_7d8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_7d8,"zeMemAllocHost",&local_802);
  local_800 = local_7b8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_7b8,"zeMemAllocShared",&local_803);
  local_804 = 0;
  local_798 = (iterator)local_7f8;
  local_790 = 3;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_805);
  __l_00._M_len = local_790;
  __l_00._M_array = local_798;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_50,__l_00,&local_805);
  local_865 = 1;
  local_863 = 1;
  local_860 = local_858;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_858,"zeMemFree",&local_861);
  local_860 = local_838;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_838,"zeMemFreeExt",&local_862);
  local_863 = 0;
  local_818 = (iterator)local_858;
  local_810 = 2;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_864);
  __l._M_len = local_810;
  __l._M_array = local_818;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&vStack_38,__l,&local_864);
  local_865 = 0;
  local_866 = 0;
  local_20 = &local_230;
  local_18 = (pointer)0xb;
  std::allocator<validation_layer::ctorsAndDtors>::allocator(&local_867);
  __l_21._M_len = (size_type)local_18;
  __l_21._M_array = local_20;
  std::vector<validation_layer::ctorsAndDtors,_std::allocator<validation_layer::ctorsAndDtors>_>::
  vector(in_RDI,__l_21,&local_867);
  std::allocator<validation_layer::ctorsAndDtors>::~allocator(&local_867);
  local_be8 = (ctorsAndDtors *)&stack0xffffffffffffffe0;
  do {
    local_be8 = local_be8 + -1;
    ctorsAndDtors::~ctorsAndDtors(local_be8);
  } while (local_be8 != &local_230);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_864);
  local_c00 = (string *)&local_818;
  do {
    local_c00 = local_c00 + -0x20;
    std::__cxx11::string::~string(local_c00);
  } while (local_c00 != local_858);
  std::allocator<char>::~allocator((allocator<char> *)&local_862);
  std::allocator<char>::~allocator((allocator<char> *)&local_861);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_805);
  local_c18 = (string *)&local_798;
  do {
    local_c18 = local_c18 + -0x20;
    std::__cxx11::string::~string(local_c18);
  } while (local_c18 != local_7f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_803);
  std::allocator<char>::~allocator((allocator<char> *)&local_802);
  std::allocator<char>::~allocator((allocator<char> *)&local_801);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_783);
  local_c30 = (string *)&local_758;
  do {
    local_c30 = local_c30 + -0x20;
    std::__cxx11::string::~string(local_c30);
  } while (local_c30 != local_778);
  std::allocator<char>::~allocator((allocator<char> *)&local_781);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_743);
  local_c48 = (string *)&local_718;
  do {
    local_c48 = local_c48 + -0x20;
    std::__cxx11::string::~string(local_c48);
  } while (local_c48 != local_738);
  std::allocator<char>::~allocator((allocator<char> *)&local_741);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_703);
  local_c60 = (string *)&local_6d8;
  do {
    local_c60 = local_c60 + -0x20;
    std::__cxx11::string::~string(local_c60);
  } while (local_c60 != local_6f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_701);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_6c4);
  local_c78 = (string *)&local_678;
  do {
    local_c78 = local_c78 + -0x20;
    std::__cxx11::string::~string(local_c78);
  } while (local_c78 != local_6b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_6c2);
  std::allocator<char>::~allocator((allocator<char> *)&local_6c1);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_663);
  local_c90 = (string *)&local_638;
  do {
    local_c90 = local_c90 + -0x20;
    std::__cxx11::string::~string(local_c90);
  } while (local_c90 != local_658);
  std::allocator<char>::~allocator((allocator<char> *)&local_661);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_623);
  local_ca8 = (string *)&local_5f8;
  do {
    local_ca8 = local_ca8 + -0x20;
    std::__cxx11::string::~string(local_ca8);
  } while (local_ca8 != local_618);
  std::allocator<char>::~allocator((allocator<char> *)&local_621);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_5e3);
  local_cc0 = (string *)&local_5b8;
  do {
    local_cc0 = local_cc0 + -0x20;
    std::__cxx11::string::~string(local_cc0);
  } while (local_cc0 != local_5d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_5e1);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_5a3);
  local_cd8 = (string *)&local_578;
  do {
    local_cd8 = local_cd8 + -0x20;
    std::__cxx11::string::~string(local_cd8);
  } while (local_cd8 != local_598);
  std::allocator<char>::~allocator((allocator<char> *)&local_5a1);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_563);
  local_cf0 = (string *)&local_538;
  do {
    local_cf0 = local_cf0 + -0x20;
    std::__cxx11::string::~string(local_cf0);
  } while (local_cf0 != local_558);
  std::allocator<char>::~allocator((allocator<char> *)&local_561);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_524);
  local_d08 = (string *)&local_4d8;
  do {
    local_d08 = local_d08 + -0x20;
    std::__cxx11::string::~string(local_d08);
  } while (local_d08 != local_518);
  std::allocator<char>::~allocator((allocator<char> *)&local_522);
  std::allocator<char>::~allocator((allocator<char> *)&local_521);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_4c3);
  local_d20 = (string *)&local_498;
  do {
    local_d20 = local_d20 + -0x20;
    std::__cxx11::string::~string(local_d20);
  } while (local_d20 != local_4b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_4c1);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_483);
  local_d38 = (string *)&local_458;
  do {
    local_d38 = local_d38 + -0x20;
    std::__cxx11::string::~string(local_d38);
  } while (local_d38 != local_478);
  std::allocator<char>::~allocator((allocator<char> *)&local_481);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_443);
  local_d50 = (string *)&local_418;
  do {
    local_d50 = local_d50 + -0x20;
    std::__cxx11::string::~string(local_d50);
  } while (local_d50 != local_438);
  std::allocator<char>::~allocator((allocator<char> *)&local_441);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_403);
  local_d68 = (string *)&local_3d8;
  do {
    local_d68 = local_d68 + -0x20;
    std::__cxx11::string::~string(local_d68);
  } while (local_d68 != local_3f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_401);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_3c3);
  local_d80 = (string *)&local_398;
  do {
    local_d80 = local_d80 + -0x20;
    std::__cxx11::string::~string(local_d80);
  } while (local_d80 != local_3b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_3c1);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_383);
  local_d98 = (string *)&local_358;
  do {
    local_d98 = local_d98 + -0x20;
    std::__cxx11::string::~string(local_d98);
  } while (local_d98 != local_378);
  std::allocator<char>::~allocator((allocator<char> *)&local_381);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_343);
  local_db0 = (string *)&local_318;
  do {
    local_db0 = local_db0 + -0x20;
    std::__cxx11::string::~string(local_db0);
  } while (local_db0 != local_338);
  std::allocator<char>::~allocator((allocator<char> *)&local_341);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_303);
  local_dc8 = (string *)&local_2d8;
  do {
    local_dc8 = local_dc8 + -0x20;
    std::__cxx11::string::~string(local_dc8);
  } while (local_dc8 != local_2f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_301);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_2c3);
  local_de0 = (string *)&local_298;
  do {
    local_de0 = local_de0 + -0x20;
    std::__cxx11::string::~string(local_de0);
  } while (local_de0 != local_2b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2c1);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_286);
  local_df8 = (string *)&local_248;
  do {
    local_df8 = local_df8 + -0x20;
    std::__cxx11::string::~string(local_df8);
  } while (local_df8 != local_268);
  std::allocator<char>::~allocator((allocator<char> *)&local_271);
  return in_RDI;
}

Assistant:

static std::vector<ctorsAndDtors> createDestroySet() {
        return {
            {{"zeContextCreate"}, {"zeContextDestroy"}},
            {{"zeCommandQueueCreate"}, {"zeCommandQueueDestroy"}},
            {{"zeModuleCreate"}, {"zeModuleDestroy"}},
            {{"zeKernelCreate"}, {"zeKernelDestroy"}},
            {{"zeEventPoolCreate"}, {"zeEventPoolDestroy"}},
            {{"zeCommandListCreateImmediate", "zeCommandListCreate"}, {"zeCommandListDestroy"}},
            {{"zeEventCreate"}, {"zeEventDestroy"}},
            {{"zeFenceCreate"}, {"zeFenceDestroy"}},
            {{"zeImageCreate", "zeImageViewCreateExt"}, {"zeImageDestroy"}},
            {{"zeSamplerCreate"}, {"zeSamplerDestroy"}},
            {{"zeMemAllocDevice", "zeMemAllocHost", "zeMemAllocShared"}, {"zeMemFree", "zeMemFreeExt"}}
        };
    }